

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O3

void charls::transform_triplet_to_line<charls::transform_hp2<unsigned_char>,unsigned_char>
               (triplet<unsigned_char> *source,size_t pixel_stride_in,uchar *destination,
               size_t pixel_stride,transform_hp2<unsigned_char> *transform,uint32_t mask)

{
  byte bVar1;
  byte bVar2;
  uchar uVar3;
  anon_union_1_2_7f9ecb7a_for_triplet<unsigned_char>_5 *paVar4;
  size_t sVar5;
  uint uVar6;
  
  if (pixel_stride <= pixel_stride_in) {
    pixel_stride_in = pixel_stride;
  }
  if (pixel_stride_in != 0) {
    paVar4 = &source->field_2;
    sVar5 = 0;
    do {
      bVar1 = ((anon_union_1_2_7f9ecc14_for_triplet<unsigned_char>_3 *)(paVar4 + -1))->v2;
      uVar6 = (((triplet<unsigned_char> *)(paVar4 + -2))->field_0).v1 & mask;
      bVar2 = paVar4->v3;
      uVar3 = (uchar)(bVar1 & mask);
      destination[sVar5] = ((char)uVar6 - uVar3) + 0x80;
      destination[sVar5 + pixel_stride] = uVar3;
      destination[sVar5 + pixel_stride * 2] =
           ((bVar2 & (byte)mask) - (char)((bVar1 & mask) + uVar6 >> 1)) + 0x80;
      sVar5 = sVar5 + 1;
      paVar4 = paVar4 + 3;
    } while (pixel_stride_in != sVar5);
  }
  return;
}

Assistant:

void transform_triplet_to_line(const triplet<PixelType>* source, const size_t pixel_stride_in, PixelType* destination,
                               const size_t pixel_stride, Transform& transform, const uint32_t mask) noexcept
{
    const auto pixel_count{std::min(pixel_stride, pixel_stride_in)};
    const triplet<PixelType>* type_buffer_in{source};

    for (size_t i{}; i < pixel_count; ++i)
    {
        const triplet<PixelType> color{type_buffer_in[i]};
        const triplet<PixelType> color_transformed{transform(color.v1 & mask, color.v2 & mask, color.v3 & mask)};

        destination[i] = color_transformed.v1;
        destination[i + pixel_stride] = color_transformed.v2;
        destination[i + 2 * pixel_stride] = color_transformed.v3;
    }
}